

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_optimize_ai_lookup.hpp
# Opt level: O2

void __thiscall
PatchOptimizeAILookup::inject_code(PatchOptimizeAILookup *this,ROM *rom,World *world)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar1;
  LandstalkerException *this_00;
  DataRegister local_f8;
  string local_e8;
  Code func;
  Param local_50;
  undefined1 local_48;
  undefined **local_40;
  undefined1 local_38;
  
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &func._labels._M_t._M_impl.super__Rb_tree_header._M_header;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_e8._M_string_length = local_e8._M_string_length & 0xffffffffffffff00;
  local_e8._M_dataplus._M_p = (pointer)&PTR_getXn_00246bf0;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  md::Code::moveq(&func,'\0',(DataRegister *)&local_e8);
  local_e8._M_dataplus._M_p = (pointer)&PTR_getXn_00246d28;
  local_e8.field_2._M_local_buf[0] = 5;
  local_e8._M_string_length = (size_type)&PTR_getXn_00246c60;
  local_e8.field_2._8_3_ = 0x2003b;
  local_f8.super_Register._code = '\0';
  local_f8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246bf0;
  md::Code::moveb(&func,(Param *)&local_e8,(Param *)&local_f8);
  local_e8._M_string_length = local_e8._M_string_length & 0xffffffffffffff00;
  local_e8._M_dataplus._M_p = (pointer)&PTR_getXn_00246bf0;
  local_f8.super_Register._code = '\0';
  local_f8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246bf0;
  md::Code::addw(&func,(Param *)&local_e8,&local_f8,false);
  local_e8._M_string_length = local_e8._M_string_length & 0xffffffffffffff00;
  local_e8._M_dataplus._M_p = (pointer)&PTR_getXn_00246bf0;
  local_f8.super_Register._code = '\0';
  local_f8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246bf0;
  md::Code::addw(&func,(Param *)&local_e8,&local_f8,false);
  local_e8._M_string_length = local_e8._M_string_length & 0xffffffffffffff00;
  local_e8._M_dataplus._M_p = (pointer)&PTR_getXn_00246bf0;
  local_f8.super_Register._code = '\0';
  local_f8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246bf0;
  md::Code::addw(&func,(Param *)&local_e8,&local_f8,false);
  local_e8._M_string_length._0_1_ = 1;
  local_e8._M_dataplus._M_p = (pointer)&PTR_getXn_00246bf0;
  local_f8.super_Register._code = '\0';
  local_f8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246bf0;
  md::Code::addw(&func,(Param *)&local_e8,&local_f8,false);
  local_e8._M_string_length = (ulong)local_e8._M_string_length._1_7_ << 8;
  local_e8._M_dataplus._M_p = (pointer)&PTR_getXn_00246c60;
  md::Code::lea(&func,this->_ai_table_addr,(AddressRegister *)&local_e8);
  local_f8.super_Register._code = '\0';
  local_f8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246c60;
  local_e8.field_2._M_allocated_capacity = (size_type)&local_40;
  local_38 = 0;
  local_40 = &PTR_getXn_00246bf0;
  local_e8._M_dataplus._M_p = (pointer)&PTR_getXn_00246d68;
  local_e8.field_2._8_4_ = 2;
  local_e8.field_2._M_local_buf[0xc] = '\0';
  local_48 = 0;
  local_50._vptr_Param = (_func_int **)&PTR_getXn_00246bf0;
  local_e8._M_string_length = (size_type)&local_f8;
  md::Code::movel(&func,(Param *)&local_e8,&local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"default_address",(allocator<char> *)&local_f8);
  md::Code::bmi(&func,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  local_e8._M_string_length = local_e8._M_string_length & 0xffffffffffffff00;
  local_e8._M_dataplus._M_p = (pointer)&PTR_getXn_00246bf0;
  local_f8.super_Register._code = '\0';
  local_f8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246c60;
  md::Code::movel(&func,(Param *)&local_e8,(Param *)&local_f8);
  local_e8._M_string_length = local_e8._M_string_length & 0xffffffffffffff00;
  local_e8._M_dataplus._M_p = (pointer)&PTR_getXn_00246bf0;
  md::Code::moveq(&func,'\0',(DataRegister *)&local_e8);
  local_e8._M_dataplus._M_p = (pointer)&PTR_getXn_00246d28;
  local_e8.field_2._M_allocated_capacity =
       local_e8.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_e8._M_string_length = (size_type)&PTR_getXn_00246c60;
  local_e8.field_2._8_3_ = 0x20000;
  md::Code::jmp(&func,(Param *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"default_address",(allocator<char> *)&local_f8);
  md::Code::label(&func,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  md::Code::jsr(&func,0x1a8ada);
  md::Code::rts(&func);
  md::ROM::set_code(rom,0x1a83f0,&func);
  pvVar1 = md::Code::get_bytes(&func);
  if ((pointer)0xffffffffffe57be6 <
      (pvVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish +
      (-0x29 - (long)(pvVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start)) {
    md::Code::~Code(&func);
    return;
  }
  this_00 = (LandstalkerException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"Replacement function is too large and is overlapping other code!",
             (allocator<char> *)&local_f8);
  LandstalkerException::LandstalkerException(this_00,&local_e8);
  __cxa_throw(this_00,&LandstalkerException::typeinfo,LandstalkerException::~LandstalkerException);
}

Assistant:

void inject_code(md::ROM& rom, World& world) override
    {
        md::Code func;
        {
            func.moveq(0, reg_D0);
            // Store entity ID in D0, and multiply it by 8 to form an offset
            func.moveb(addr_(reg_A5, 0x3B), reg_D0);
            func.addw(reg_D0, reg_D0);
            func.addw(reg_D0, reg_D0);
            func.addw(reg_D0, reg_D0);
            // Add "offset" D1 (initialized externally, either 0 or 4) to get AI variant A or B.
            func.addw(reg_D1, reg_D0);
            // Fetch the address from the AI jump table, storing it in D0 to save a CMPA
            func.lea(_ai_table_addr, reg_A0);
            func.movel(addr_(reg_A0, reg_D0), reg_D0);
            func.bmi("default_address");
            {
                // Put the address back in an address register, and jump on it
                func.movel(reg_D0, reg_A0);
                func.moveq(0, reg_D0);
                func.jmp(addr_(reg_A0));
            }
            func.label("default_address");
            {
                func.jsr(0x1A8ADA); // LoadSpecialAI
                func.rts();
            }
        }

        rom.set_code(0x1A83F0, func);
        if(0x1A83F0 + func.get_bytes().size() > offsets::ENEMY_AI_TABLE)
            throw LandstalkerException("Replacement function is too large and is overlapping other code!");
    }